

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void CheckCaption(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *pAVar3;
  uint vers;
  
  pAVar3 = node->attributes;
  while (pAVar3 != (AttVal *)0x0) {
    pAVar1 = pAVar3->next;
    prvTidyCheckAttribute(doc,node,pAVar3);
    pAVar3 = pAVar1;
  }
  pAVar3 = prvTidyAttrGetById(node,TidyAttr_ALIGN);
  if ((pAVar3 == (AttVal *)0x0) || (pAVar3->value == (ctmbstr)0x0)) {
    return;
  }
  iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"left");
  if (iVar2 != 0) {
    if (pAVar3->value == (ctmbstr)0x0) {
LAB_00145f36:
      prvTidyReportAttrError(doc,node,pAVar3,0x22b);
      return;
    }
    iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"right");
    if (iVar2 != 0) {
      if ((pAVar3->value == (ctmbstr)0x0) ||
         ((iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"top"), iVar2 != 0 &&
          ((pAVar3->value == (ctmbstr)0x0 ||
           (iVar2 = prvTidytmbstrcasecmp(pAVar3->value,"bottom"), iVar2 != 0))))))
      goto LAB_00145f36;
      vers = 0xfffffffc;
      goto LAB_00145f5c;
    }
  }
  vers = 0x248;
LAB_00145f5c:
  prvTidyConstrainVersion(doc,vers);
  return;
}

Assistant:

void CheckCaption(TidyDocImpl* doc, Node *node)
{
    AttVal *attval;

    TY_(CheckAttributes)(doc, node);

    attval = TY_(AttrGetById)(node, TidyAttr_ALIGN);

    if (!AttrHasValue(attval))
        return;

    if (AttrValueIs(attval, "left") || AttrValueIs(attval, "right"))
        TY_(ConstrainVersion)(doc, VERS_HTML40_LOOSE);
    else if (AttrValueIs(attval, "top") || AttrValueIs(attval, "bottom"))
        TY_(ConstrainVersion)(doc, ~(VERS_HTML20|VERS_HTML32));
    else
        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
}